

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomTwoAction.cpp
# Opt level: O0

ActionResults * __thiscall GreenRoomTwoAction::Go(GreenRoomTwoAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  allocator local_e9;
  string local_e8 [38];
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [38];
  undefined1 local_9a;
  allocator local_99;
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  GreenRoomTwoAction *local_18;
  GreenRoomTwoAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == NORTH) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    local_4d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"You go north.\n",&local_39);
    ActionResults::ActionResults(pAVar2,G_ROOM4_KID,(string *)local_38);
    local_4d = 0;
    this_local = (GreenRoomTwoAction *)pAVar2;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == SOUTH) {
      pAVar2 = (ActionResults *)operator_new(0x30);
      local_72 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"You go south.\n",&local_71);
      ActionResults::ActionResults(pAVar2,G_ROOM3_BASIN,(string *)local_70);
      local_72 = 0;
      this_local = (GreenRoomTwoAction *)pAVar2;
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    else {
      iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (iVar1 == EAST) {
        pAVar2 = (ActionResults *)operator_new(0x30);
        local_9a = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,"You go back to the boat room.\n",&local_99);
        ActionResults::ActionResults(pAVar2,G_ROOM1_SIDE2,(string *)local_98);
        local_9a = 0;
        this_local = (GreenRoomTwoAction *)pAVar2;
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
      }
      else {
        iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
        if (iVar1 == WEST) {
          pAVar2 = (ActionResults *)operator_new(0x30);
          local_c2 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_c0,"There is a wall, you can\'t go that way.\n",&local_c1);
          ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_c0);
          local_c2 = 0;
          this_local = (GreenRoomTwoAction *)pAVar2;
          std::__cxx11::string::~string(local_c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        }
        else {
          pAVar2 = (ActionResults *)operator_new(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e8,"You can\'t go there.\n",&local_e9);
          ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_e8);
          this_local = (GreenRoomTwoAction *)pAVar2;
          std::__cxx11::string::~string(local_e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        }
      }
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *GreenRoomTwoAction::Go() {

    if (commands->getMainItem() == NORTH) {
        return new ActionResults(G_ROOM4_KID, "You go north.\n");
    }
    if (commands->getMainItem() == SOUTH) {
        return new ActionResults(G_ROOM3_BASIN, "You go south.\n");
    }
    if (commands->getMainItem() == EAST) {
        return new ActionResults(G_ROOM1_SIDE2, "You go back to the boat room.\n");
    }
    if (commands->getMainItem() == WEST) {
        return new ActionResults(CURRENT, "There is a wall, you can't go that way.\n");
    }
    return new ActionResults(CURRENT,"You can't go there.\n");
}